

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

MatchMatrix * __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>const&>
::
AnalyzeElements<__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (MatchMatrix *__return_storage_ptr__,
          UnorderedElementsAreMatcherImpl<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>const&>
          *this,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                elem_first,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          elem_last,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchResultListener *listener)

{
  size_type irhs_00;
  size_t ilhs_00;
  ostream *num_elements_00;
  bool bVar1;
  MatcherBase<const_std::pair<int,_int>_&> *this_00;
  reference ppVar2;
  size_type sVar3;
  size_type sVar4;
  reference pcVar5;
  pair<int,_int> *value;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_d0;
  size_type local_c8;
  size_t irhs_1;
  size_t ilhs;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_b0;
  const_iterator did_match_iter;
  size_type local_a0;
  size_t irhs;
  undefined1 local_68 [8];
  DummyMatchResultListener dummy;
  size_t num_elements;
  vector<char,_std::allocator<char>_> did_match;
  MatchResultListener *listener_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *element_printouts_local;
  UnorderedElementsAreMatcherImpl<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&>
  *this_local;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  elem_last_local;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  elem_first_local;
  MatchMatrix *matrix;
  
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = listener;
  this_local = (UnorderedElementsAreMatcherImpl<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&>
                *)elem_last._M_current;
  elem_last_local = elem_first;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(element_printouts);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&num_elements);
  dummy.super_MatchResultListener.stream_ = (ostream *)0x0;
  DummyMatchResultListener::DummyMatchResultListener((DummyMatchResultListener *)local_68);
  while (bVar1 = __gnu_cxx::operator!=
                           (&elem_last_local,
                            (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                             *)&this_local),
        num_elements_00 = dummy.super_MatchResultListener.stream_, bVar1) {
    bVar1 = MatchResultListener::IsInterested
                      ((MatchResultListener *)
                       did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
    if (bVar1) {
      ppVar2 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&elem_last_local);
      PrintToString<std::pair<int,int>>((string *)&irhs,(testing *)ppVar2,value);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(element_printouts,(value_type *)&irhs);
      std::__cxx11::string::~string((string *)&irhs);
    }
    for (local_a0 = 0;
        sVar3 = std::
                vector<testing::Matcher<const_std::pair<int,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<int,_int>_&>_>_>
                ::size((vector<testing::Matcher<const_std::pair<int,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<int,_int>_&>_>_>
                        *)(this + 0x28)), local_a0 != sVar3; local_a0 = local_a0 + 1) {
      this_00 = &std::
                 vector<testing::Matcher<const_std::pair<int,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<int,_int>_&>_>_>
                 ::operator[]((vector<testing::Matcher<const_std::pair<int,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<int,_int>_&>_>_>
                               *)(this + 0x28),local_a0)->
                 super_MatcherBase<const_std::pair<int,_int>_&>;
      ppVar2 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&elem_last_local);
      did_match_iter._M_current._7_1_ =
           MatcherBase<const_std::pair<int,_int>_&>::MatchAndExplain
                     (this_00,ppVar2,(MatchResultListener *)local_68);
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)&num_elements,
                 (value_type *)((long)&did_match_iter._M_current + 7));
    }
    dummy.super_MatchResultListener.stream_ = dummy.super_MatchResultListener.stream_ + 1;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&elem_last_local);
  }
  did_match_iter._M_current._6_1_ = 0;
  sVar3 = std::
          vector<testing::Matcher<const_std::pair<int,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<int,_int>_&>_>_>
          ::size((vector<testing::Matcher<const_std::pair<int,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<int,_int>_&>_>_>
                  *)(this + 0x28));
  MatchMatrix::MatchMatrix(__return_storage_ptr__,(size_t)num_elements_00,sVar3);
  ilhs = (size_t)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)&num_elements);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_b0,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)&ilhs);
  for (irhs_1 = 0; (ostream *)irhs_1 != dummy.super_MatchResultListener.stream_; irhs_1 = irhs_1 + 1
      ) {
    for (local_c8 = 0; sVar3 = local_c8,
        sVar4 = std::
                vector<testing::Matcher<const_std::pair<int,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<int,_int>_&>_>_>
                ::size((vector<testing::Matcher<const_std::pair<int,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<int,_int>_&>_>_>
                        *)(this + 0x28)), ilhs_00 = irhs_1, irhs_00 = local_c8, sVar3 != sVar4;
        local_c8 = local_c8 + 1) {
      local_d0 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator++(&local_b0,0);
      pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_d0);
      MatchMatrix::SetEdge(__return_storage_ptr__,ilhs_00,irhs_00,*pcVar5 != '\0');
    }
  }
  did_match_iter._M_current._6_1_ = 1;
  DummyMatchResultListener::~DummyMatchResultListener((DummyMatchResultListener *)local_68);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&num_elements);
  return __return_storage_ptr__;
}

Assistant:

MatchMatrix AnalyzeElements(ElementIter elem_first, ElementIter elem_last,
                              ::std::vector<std::string>* element_printouts,
                              MatchResultListener* listener) const {
    element_printouts->clear();
    ::std::vector<char> did_match;
    size_t num_elements = 0;
    DummyMatchResultListener dummy;
    for (; elem_first != elem_last; ++num_elements, ++elem_first) {
      if (listener->IsInterested()) {
        element_printouts->push_back(PrintToString(*elem_first));
      }
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        did_match.push_back(
            matchers_[irhs].MatchAndExplain(*elem_first, &dummy));
      }
    }

    MatchMatrix matrix(num_elements, matchers_.size());
    ::std::vector<char>::const_iterator did_match_iter = did_match.begin();
    for (size_t ilhs = 0; ilhs != num_elements; ++ilhs) {
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        matrix.SetEdge(ilhs, irhs, *did_match_iter++ != 0);
      }
    }
    return matrix;
  }